

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lclin.cpp
# Opt level: O0

Factor * __thiscall libDAI::LCLin::Fdel(LCLin *this,size_t i)

{
  bool bVar1;
  vector<const_libDAI::TFactor<double>_*,_std::allocator<const_libDAI::TFactor<double>_*>_> *__x;
  long *plVar2;
  reference puVar3;
  VarSet *pVVar4;
  Var *n;
  undefined8 in_RDX;
  long *in_RSI;
  Factor *in_RDI;
  size_t K;
  nb_cit I;
  vector<const_libDAI::TFactor<double>_*,_std::allocator<const_libDAI::TFactor<double>_*>_> pfacs;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> facs;
  vector<const_libDAI::TFactor<double>_*,_std::allocator<const_libDAI::TFactor<double>_*>_>
  *in_stack_00000198;
  VarSet *in_stack_000001a0;
  LCLin *in_stack_000001a8;
  value_type *in_stack_fffffffffffffe98;
  FactorGraph *in_stack_fffffffffffffea0;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  *in_stack_fffffffffffffea8;
  LCLin *in_stack_fffffffffffffeb0;
  VarSet *this_00;
  Factor *this_01;
  VarSet *local_b0;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_50 [2];
  TFactor<double> *in_stack_ffffffffffffffc0;
  TFactor<double> *in_stack_ffffffffffffffc8;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> local_30;
  undefined8 local_18;
  
  this_01 = in_RDI;
  local_18 = in_RDX;
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::vector
            ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)0xb80356)
  ;
  std::vector<const_libDAI::TFactor<double>_*,_std::allocator<const_libDAI::TFactor<double>_*>_>::
  vector((vector<const_libDAI::TFactor<double>_*,_std::allocator<const_libDAI::TFactor<double>_*>_>
          *)0xb80363);
  (**(code **)(*in_RSI + 0x28))();
  __x = (vector<const_libDAI::TFactor<double>_*,_std::allocator<const_libDAI::TFactor<double>_*>_> *
        )FactorGraph::nbV(in_stack_fffffffffffffea0,(size_t)in_stack_fffffffffffffe98);
  local_50[0]._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe98
                 );
  while( true ) {
    (**(code **)(*in_RSI + 0x28))();
    FactorGraph::nbV(in_stack_fffffffffffffea0,(size_t)in_stack_fffffffffffffe98);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe98);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)in_stack_fffffffffffffea0,
                       (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)in_stack_fffffffffffffe98);
    if (!bVar1) break;
    plVar2 = (long *)(**(code **)(*in_RSI + 0x28))();
    puVar3 = __gnu_cxx::
             __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(local_50);
    (**(code **)(*plVar2 + 0x50))(plVar2,*puVar3);
    __gnu_cxx::
    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator*(local_50);
    phi(in_stack_fffffffffffffeb0,(size_t)in_stack_fffffffffffffea8,
        (size_t)in_stack_fffffffffffffea0);
    TFactor<double>::operator*(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::push_back
              ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
               in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    TFactor<double>::~TFactor((TFactor<double> *)in_stack_fffffffffffffea0);
    __gnu_cxx::
    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(in_stack_fffffffffffffea8,(int)((ulong)in_stack_fffffffffffffea0 >> 0x20));
  }
  local_b0 = (VarSet *)0x0;
  while( true ) {
    this_00 = local_b0;
    pVVar4 = (VarSet *)
             std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::size
                       (&local_30);
    if (pVVar4 <= this_00) break;
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::operator[]
              (&local_30,(size_type)local_b0);
    std::vector<const_libDAI::TFactor<double>_*,_std::allocator<const_libDAI::TFactor<double>_*>_>::
    push_back((vector<const_libDAI::TFactor<double>_*,_std::allocator<const_libDAI::TFactor<double>_*>_>
               *)in_stack_fffffffffffffea0,(value_type *)in_stack_fffffffffffffe98);
    local_b0 = (VarSet *)
               ((long)&(local_b0->_vars).
                       super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                       super__Vector_impl_data._M_start + 1);
  }
  n = (Var *)(**(code **)(*in_RSI + 0x28))();
  (**(code **)(n->_label + 0x30))(n,local_18);
  VarSet::VarSet(this_00,n);
  std::vector<const_libDAI::TFactor<double>_*,_std::allocator<const_libDAI::TFactor<double>_*>_>::
  vector((vector<const_libDAI::TFactor<double>_*,_std::allocator<const_libDAI::TFactor<double>_*>_>
          *)this_01,__x);
  notSumProd(in_stack_000001a8,in_stack_000001a0,in_stack_00000198);
  std::vector<const_libDAI::TFactor<double>_*,_std::allocator<const_libDAI::TFactor<double>_*>_>::
  ~vector((vector<const_libDAI::TFactor<double>_*,_std::allocator<const_libDAI::TFactor<double>_*>_>
           *)this_00);
  VarSet::~VarSet((VarSet *)0xb80614);
  std::vector<const_libDAI::TFactor<double>_*,_std::allocator<const_libDAI::TFactor<double>_*>_>::
  ~vector((vector<const_libDAI::TFactor<double>_*,_std::allocator<const_libDAI::TFactor<double>_*>_>
           *)this_00);
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::~vector
            ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)this_00);
  return in_RDI;
}

Assistant:

Factor LCLin::Fdel( size_t i ) { 
        std::vector<Factor> facs;
        std::vector<const Factor *> pfacs;
        for( FactorGraph::nb_cit I = grm().nbV(i).begin(); I != grm().nbV(i).end(); I++ )
            facs.push_back( grm().factor(*I) * phi(i,*I) );
        for( size_t K = 0; K < facs.size(); K++ )
            pfacs.push_back( &(facs[K]) );
        return notSumProd( grm().var(i), pfacs );
    }